

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::
       tuple_caster<std::pair,std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>,std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>>
       ::
       cast_impl<std::pair<std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>,std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>>,0ul,1ul>
                 (vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                  *src,return_value_policy policy,handle parent)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_40;
  PyObject *local_38;
  handle local_30;
  
  local_40.super_handle =
       list_caster<std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>,std::tuple<double,double>>
       ::cast<std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>>
                 (src,policy,parent);
  local_38 = (PyObject *)
             list_caster<std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>,std::tuple<double,double>>
             ::
             cast<std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>>
                       (src + 1,policy,parent);
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)&local_40.super_handle.m_ptr + lVar2) == 0) goto LAB_001d8e0c;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  tuple::tuple((tuple *)&local_30,2);
  hVar3.m_ptr = local_30.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_40.super_handle.m_ptr + lVar2);
    *(undefined8 *)((long)&local_40.super_handle.m_ptr + lVar2) = 0;
    if (((local_30.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                    ,0x588,
                    "static handle pybind11::detail::tuple_caster<std::pair, std::vector<std::tuple<double, double>>, std::vector<std::tuple<double, double>>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <std::vector<std::tuple<double, double>>, std::vector<std::tuple<double, double>>>, T = std::pair<std::vector<std::tuple<double, double>>, std::vector<std::tuple<double, double>>>, Is = <0UL, 1UL>]"
                   );
    }
    *(undefined8 *)((long)&local_30.m_ptr[1].ob_type + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  local_30.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_30);
LAB_001d8e0c:
  lVar2 = 8;
  do {
    object::~object((object *)((long)&local_40.super_handle.m_ptr + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }